

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# green.c
# Opt level: O1

int green_coroutine_release(green_coroutine_t coro)

{
  int *piVar1;
  undefined8 *puVar2;
  void *pvVar3;
  long in_RSI;
  green_coroutine_t __ptr;
  int iStack_4c;
  
  if (coro == (green_coroutine_t)0x0) {
    green_coroutine_release_cold_3();
    __ptr = coro;
LAB_00103a1b:
    green_coroutine_release_cold_2();
  }
  else {
    __ptr = coro;
    if (coro->loop == (green_loop_t)0x0) goto LAB_00103a1b;
    piVar1 = &coro->refs;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 != 0) {
      return 0;
    }
    __ptr = (green_coroutine_t)coro->stack;
    if (__ptr != (green_coroutine_t)0x0) {
      free(__ptr);
      coro->stack = (void *)0x0;
      piVar1 = &coro->loop->coroutines;
      *piVar1 = *piVar1 + -1;
      free(coro);
      return 0;
    }
  }
  green_coroutine_release_cold_1();
  if (in_RSI == 0 || __ptr == (green_coroutine_t)0x0) {
    puVar2 = (undefined8 *)0x0;
LAB_00103a75:
    return (int)puVar2;
  }
  if (0 < *(int *)&__ptr->loop) {
    puVar2 = (undefined8 *)green_malloc(0x30);
    *puVar2 = __ptr;
    *(undefined4 *)(puVar2 + 1) = 1;
    pvVar3 = green_malloc((int)in_RSI * 8);
    puVar2[2] = pvVar3;
    puVar2[4] = in_RSI;
    goto LAB_00103a75;
  }
  green_poller_init_cold_1();
  if (__ptr == (green_coroutine_t)0x0) {
LAB_00103aa7:
    pvVar3 = (void *)0x0;
LAB_00103aa9:
    return (int)pvVar3;
  }
  if (__ptr->loop == (green_loop_t)0x0) {
    green_poller_size_cold_3();
  }
  else {
    pvVar3 = *(void **)&__ptr->state;
    if (__ptr->object <= pvVar3) {
      if ((void *)(__ptr->context).__uc_flags <= __ptr->object) goto LAB_00103aa9;
      green_poller_size_cold_1();
      goto LAB_00103aa7;
    }
  }
  green_poller_size_cold_2();
  if (__ptr != (green_coroutine_t)0x0) {
    if (__ptr->loop == (green_loop_t)0x0) {
      green_poller_used_cold_3();
LAB_00103adf:
      green_poller_used_cold_2();
      if (__ptr == (green_coroutine_t)0x0) {
        return 0;
      }
      if (__ptr->loop == (green_loop_t)0x0) {
        green_poller_done_cold_3();
      }
      else {
        pvVar3 = __ptr->object;
        if (pvVar3 <= *(void **)&__ptr->state) {
          if (pvVar3 < (void *)(__ptr->context).__uc_flags) {
            green_poller_done_cold_1();
            return 0;
          }
          return (int)pvVar3 - (int)(__ptr->context).__uc_flags;
        }
      }
      green_poller_done_cold_2();
      if (__ptr == (green_coroutine_t)0x0) {
        return 1;
      }
      if (0 < __ptr->refs) {
        __ptr->refs = __ptr->refs + 1;
        return 0;
      }
      green_poller_acquire_cold_1();
      if (__ptr == (green_coroutine_t)0x0) {
        return 1;
      }
      green_future_release_cold_1();
      return iStack_4c;
    }
    pvVar3 = __ptr->object;
    if (*(void **)&__ptr->state < pvVar3) goto LAB_00103adf;
    if ((void *)(__ptr->context).__uc_flags <= pvVar3) goto LAB_00103ad8;
    green_poller_used_cold_1();
  }
  pvVar3 = (void *)0x0;
LAB_00103ad8:
  return (int)pvVar3;
}

Assistant:

int green_coroutine_release(green_coroutine_t coro)
{
    green_assert(coro != NULL);
    green_assert(coro->loop != NULL);
    if (--coro->refs == 0) {
#if GREEN_USE_UCONTEXT
        green_assert(coro->stack != NULL);
        green_free(coro->stack);
        coro->stack = NULL;
#endif
        --coro->loop->coroutines;
        green_free(coro);
    }
    return GREEN_SUCCESS;
}